

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_237::InfoCollector::receiveChildValue
          (InfoCollector *this,Expression *child,Expression *parent)

{
  CollectedFuncInfo *this_00;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  ExpressionLocation local_98;
  ExpressionLocation local_88;
  undefined1 local_78 [84];
  uint local_24;
  Expression *pEStack_20;
  Index i;
  Expression *parent_local;
  Expression *child_local;
  InfoCollector *this_local;
  
  pEStack_20 = parent;
  parent_local = child;
  child_local = (Expression *)this;
  bVar1 = isRelevant(this,parent);
  if ((bVar1) && (bVar1 = isRelevant(this,parent_local), bVar1)) {
    sVar2 = wasm::Type::size(&parent_local->type);
    sVar3 = wasm::Type::size(&pEStack_20->type);
    if (sVar2 != sVar3) {
      __assert_fail("child->type.size() == parent->type.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/possible-contents.cpp"
                    ,0x4da,
                    "void wasm::(anonymous namespace)::InfoCollector::receiveChildValue(Expression *, Expression *)"
                   );
    }
    for (local_24 = 0; uVar4 = (ulong)local_24, sVar2 = wasm::Type::size(&parent_local->type),
        uVar4 < sVar2; local_24 = local_24 + 1) {
      this_00 = this->info;
      local_88.expr = parent_local;
      local_88.tupleIndex = local_24;
      std::
      variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::ResultLocation,wasm::BreakTargetLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::NullLocation,wasm::ConeReadLocation>
      ::variant<wasm::ExpressionLocation,void,void,wasm::ExpressionLocation,void>
                ((variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::ResultLocation,wasm::BreakTargetLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::NullLocation,wasm::ConeReadLocation>
                  *)local_78,&local_88);
      local_98.expr = pEStack_20;
      local_98.tupleIndex = local_24;
      std::
      variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::ResultLocation,wasm::BreakTargetLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::NullLocation,wasm::ConeReadLocation>
      ::variant<wasm::ExpressionLocation,void,void,wasm::ExpressionLocation,void>
                ((variant<wasm::ExpressionLocation,wasm::ParamLocation,wasm::ResultLocation,wasm::BreakTargetLocation,wasm::GlobalLocation,wasm::SignatureParamLocation,wasm::SignatureResultLocation,wasm::DataLocation,wasm::TagLocation,wasm::NullLocation,wasm::ConeReadLocation>
                  *)(local_78 + 0x28),&local_98);
      std::
      vector<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>,_std::allocator<wasm::(anonymous_namespace)::Link<std::variant<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::ResultLocation,_wasm::BreakTargetLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::NullLocation,_wasm::ConeReadLocation>_>_>_>
      ::push_back(&this_00->links,(value_type *)local_78);
    }
  }
  return;
}

Assistant:

void receiveChildValue(Expression* child, Expression* parent) {
    if (isRelevant(parent) && isRelevant(child)) {
      // The tuple sizes must match (or, if not a tuple, the size should be 1 in
      // both cases).
      assert(child->type.size() == parent->type.size());
      for (Index i = 0; i < child->type.size(); i++) {
        info.links.push_back(
          {ExpressionLocation{child, i}, ExpressionLocation{parent, i}});
      }
    }
  }